

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  uint a;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  float *output;
  byte *pbVar11;
  stbi_uc *psVar12;
  byte *pbVar13;
  long lVar14;
  int b;
  stbi_uc *psVar15;
  float *output_00;
  int c;
  ulong uVar16;
  uint uVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char cStack_4b8;
  char cStack_4b7;
  char cStack_4b6;
  char cStack_4b5;
  char cStack_4b4;
  char cStack_4b3;
  char cStack_4b2;
  char cStack_4b1;
  char buffer [1024];
  stbi_uc local_b0 [4];
  stbi_uc local_ac;
  stbi_uc local_ab;
  stbi_uc local_aa;
  stbi_uc local_a9;
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  long local_68;
  ulong local_60;
  float *local_58;
  stbi_uc *local_38;
  
  uVar9 = (ulong)(uint)req_comp;
  stbi__hdr_gettoken(s,&cStack_4b8);
  if ((CONCAT17(buffer[2],
                CONCAT16(buffer[1],
                         CONCAT15(buffer[0],
                                  CONCAT14(cStack_4b1,
                                           CONCAT13(cStack_4b2,
                                                    CONCAT12(cStack_4b3,
                                                             CONCAT11(cStack_4b4,cStack_4b5)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_4b1,
                CONCAT16(cStack_4b2,
                         CONCAT15(cStack_4b3,
                                  CONCAT14(cStack_4b4,
                                           CONCAT13(cStack_4b5,
                                                    CONCAT12(cStack_4b6,
                                                             CONCAT11(cStack_4b7,cStack_4b8)))))))
       == 0x4e41494441523f23) ||
     (CONCAT13(cStack_4b2,CONCAT12(cStack_4b3,CONCAT11(cStack_4b4,cStack_4b5))) == 0x454247 &&
      CONCAT13(cStack_4b5,CONCAT12(cStack_4b6,CONCAT11(cStack_4b7,cStack_4b8))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&cStack_4b8);
    if (cStack_4b8 != '\0') {
      bVar1 = false;
      do {
        auVar18[0] = -(cStack_4b1 == '3');
        auVar18[1] = -(buffer[0] == '2');
        auVar18[2] = -(buffer[1] == '-');
        auVar18[3] = -(buffer[2] == 'b');
        auVar18[4] = -(buffer[3] == 'i');
        auVar18[5] = -(buffer[4] == 't');
        auVar18[6] = -(buffer[5] == '_');
        auVar18[7] = -(buffer[6] == 'r');
        auVar18[8] = -(buffer[7] == 'l');
        auVar18[9] = -(buffer[8] == 'e');
        auVar18[10] = -(buffer[9] == '_');
        auVar18[0xb] = -(buffer[10] == 'r');
        auVar18[0xc] = -(buffer[0xb] == 'g');
        auVar18[0xd] = -(buffer[0xc] == 'b');
        auVar18[0xe] = -(buffer[0xd] == 'e');
        auVar18[0xf] = -(buffer[0xe] == '\0');
        auVar19[0] = -(cStack_4b8 == 'F');
        auVar19[1] = -(cStack_4b7 == 'O');
        auVar19[2] = -(cStack_4b6 == 'R');
        auVar19[3] = -(cStack_4b5 == 'M');
        auVar19[4] = -(cStack_4b4 == 'A');
        auVar19[5] = -(cStack_4b3 == 'T');
        auVar19[6] = -(cStack_4b2 == '=');
        auVar19[7] = -(cStack_4b1 == '3');
        auVar19[8] = -(buffer[0] == '2');
        auVar19[9] = -(buffer[1] == '-');
        auVar19[10] = -(buffer[2] == 'b');
        auVar19[0xb] = -(buffer[3] == 'i');
        auVar19[0xc] = -(buffer[4] == 't');
        auVar19[0xd] = -(buffer[5] == '_');
        auVar19[0xe] = -(buffer[6] == 'r');
        auVar19[0xf] = -(buffer[7] == 'l');
        auVar19 = auVar19 & auVar18;
        if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&cStack_4b8);
        iVar7 = (int)uVar9;
      } while (cStack_4b8 != '\0');
      if (bVar1) {
        stbi__hdr_gettoken(s,&cStack_4b8);
        if (cStack_4b6 == ' ' && CONCAT11(cStack_4b7,cStack_4b8) == 0x592d) {
          _rgbe_1 = &cStack_4b5;
          uVar9 = strtol(_rgbe_1,(char **)rgbe_1,10);
          _rgbe_1 = _rgbe_1 + 2;
          do {
            pcVar8 = _rgbe_1;
            _rgbe_1 = pcVar8 + 1;
          } while (pcVar8[-2] == ' ');
          if (((pcVar8[-2] == '+') && (pcVar8[-1] == 'X')) && (*pcVar8 == ' ')) {
            uVar10 = strtol(_rgbe_1,(char **)0x0,10);
            b = (int)uVar9;
            if ((b < 0x1000001) && (a = (uint)uVar10, (int)a < 0x1000001)) {
              *x = a;
              *y = b;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              c = 3;
              if (req_comp != 0) {
                c = req_comp;
              }
              iVar6 = stbi__mad4sizes_valid(a,b,c,(int)comp,iVar7);
              if (iVar6 != 0) {
                output = (float *)stbi__malloc_mad4(a,b,c,(int)comp,iVar7);
                if (output == (float *)0x0) {
LAB_001145b1:
                  pcVar8 = "outofmem";
                }
                else {
                  iVar7 = 0;
                  if (a - 0x8000 < 0xffff8008) goto LAB_001145c0;
                  if (b < 1) {
                    return output;
                  }
                  local_60 = 0;
                  local_38 = (stbi_uc *)0x0;
                  local_58 = output;
                  while( true ) {
                    sVar2 = stbi__get8(s);
                    sVar3 = stbi__get8(s);
                    sVar4 = stbi__get8(s);
                    if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((char)sVar4 < '\0')) {
                      local_ac = sVar2;
                      local_ab = sVar3;
                      local_aa = sVar4;
                      local_a9 = stbi__get8(s);
                      stbi__hdr_convert(output,&local_ac,c);
                      free(local_38);
                      iVar7 = 0;
                      iVar6 = 1;
                      do {
                        stbi__getn(s,local_b0,4);
                        stbi__hdr_convert(output + (long)(int)(c * a * iVar7) + (long)(iVar6 * c),
                                          local_b0,c);
                        iVar6 = iVar6 + 1;
                        while ((int)a <= iVar6) {
                          iVar7 = iVar7 + 1;
LAB_001145c0:
                          iVar6 = 0;
                          if (b <= iVar7) {
                            return output;
                          }
                        }
                      } while( true );
                    }
                    sVar2 = stbi__get8(s);
                    if (CONCAT11(sVar4,sVar2) != a) break;
                    if ((local_38 == (stbi_uc *)0x0) &&
                       (local_38 = (stbi_uc *)malloc((ulong)(a * 4)), local_38 == (stbi_uc *)0x0)) {
                      free(output);
                      goto LAB_001145b1;
                    }
                    local_68 = 0;
                    psVar15 = local_38;
                    do {
                      iVar7 = 0;
                      uVar16 = uVar10 & 0xffffffff;
                      do {
                        pbVar13 = s->img_buffer;
                        if (pbVar13 < s->img_buffer_end) {
LAB_00114374:
                          pbVar11 = pbVar13 + 1;
                          s->img_buffer = pbVar11;
                          bVar5 = *pbVar13;
                          uVar17 = (uint)bVar5;
                          if (bVar5 < 0x81) {
                            if ((uint)bVar5 <= (uint)uVar16) {
                              if (uVar17 != 0) {
                                lVar14 = 0;
                                do {
                                  psVar12 = s->img_buffer;
                                  if (psVar12 < s->img_buffer_end) {
LAB_0011442f:
                                    s->img_buffer = psVar12 + 1;
                                    sVar2 = *psVar12;
                                  }
                                  else {
                                    if (s->read_from_callbacks != 0) {
                                      stbi__refill_buffer(s);
                                      psVar12 = s->img_buffer;
                                      goto LAB_0011442f;
                                    }
                                    sVar2 = '\0';
                                  }
                                  psVar15[lVar14 * 4 + (long)iVar7 * 4] = sVar2;
                                  lVar14 = lVar14 + 1;
                                } while (uVar17 != (uint)lVar14);
                                iVar7 = iVar7 + (uint)lVar14;
                              }
                              goto LAB_0011446f;
                            }
                          }
                          else {
                            if (pbVar11 < s->img_buffer_end) {
LAB_001143ae:
                              s->img_buffer = pbVar11 + 1;
                              bVar5 = *pbVar11;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                stbi__refill_buffer(s);
                                pbVar11 = s->img_buffer;
                                goto LAB_001143ae;
                              }
                              bVar5 = 0;
                            }
                            uVar17 = uVar17 & 0x7f;
                            if (uVar17 <= (uint)uVar16) {
                              if ((char)uVar17 != '\0') {
                                lVar14 = 0;
                                do {
                                  psVar15[lVar14 * 4 + (long)iVar7 * 4] = bVar5;
                                  lVar14 = lVar14 + 1;
                                } while (uVar17 != (uint)lVar14);
                                iVar7 = iVar7 + (uint)lVar14;
                              }
                              goto LAB_0011446f;
                            }
                          }
                          free(output);
                          free(local_38);
                          pcVar8 = "corrupt";
                          goto LAB_00114506;
                        }
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar13 = s->img_buffer;
                          goto LAB_00114374;
                        }
LAB_0011446f:
                        uVar16 = (ulong)(a - iVar7);
                      } while (a - iVar7 != 0 && iVar7 <= (int)a);
                      local_68 = local_68 + 1;
                      psVar15 = psVar15 + 1;
                      output_00 = local_58;
                      uVar16 = uVar10 & 0x7fffffff;
                      psVar12 = local_38;
                    } while (local_68 != 4);
                    do {
                      stbi__hdr_convert(output_00,psVar12,c);
                      uVar16 = uVar16 - 1;
                      output_00 = output_00 + c;
                      psVar12 = psVar12 + 4;
                    } while (uVar16 != 0);
                    local_60 = local_60 + 1;
                    local_58 = local_58 + (uVar10 & 0xffffffff) * (long)c;
                    if (local_60 == (uVar9 & 0x7fffffff)) {
                      free(local_38);
                      return output;
                    }
                  }
                  free(output);
                  free(local_38);
                  pcVar8 = "invalid decoded scanline length";
                }
                goto LAB_00114506;
              }
            }
            pcVar8 = "too large";
            goto LAB_00114506;
          }
        }
        pcVar8 = "unsupported data layout";
        goto LAB_00114506;
      }
    }
    pcVar8 = "unsupported format";
  }
  else {
    pcVar8 = "not HDR";
  }
LAB_00114506:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar8;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}